

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

void ApplyInverseTransforms(VP8LDecoder *dec,int start_row,int num_rows,uint32_t *rows)

{
  int iVar1;
  uint32_t *out;
  VP8LTransform *transform;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)dec->next_transform_;
  iVar1 = dec->width_;
  out = dec->argb_cache_;
  if (0 < lVar2) {
    lVar3 = lVar2 + 1;
    transform = dec->transforms_ + lVar2 + -1;
    do {
      VP8LInverseTransform(transform,start_row,num_rows + start_row,rows,out);
      lVar3 = lVar3 + -1;
      transform = transform + -1;
      rows = out;
    } while (1 < lVar3);
  }
  if (rows == out) {
    return;
  }
  memcpy(out,rows,(long)iVar1 * (long)num_rows * 4);
  return;
}

Assistant:

static void ApplyInverseTransforms(VP8LDecoder* const dec,
                                   int start_row, int num_rows,
                                   const uint32_t* const rows) {
  int n = dec->next_transform_;
  const int cache_pixs = dec->width_ * num_rows;
  const int end_row = start_row + num_rows;
  const uint32_t* rows_in = rows;
  uint32_t* const rows_out = dec->argb_cache_;

  // Inverse transforms.
  while (n-- > 0) {
    VP8LTransform* const transform = &dec->transforms_[n];
    VP8LInverseTransform(transform, start_row, end_row, rows_in, rows_out);
    rows_in = rows_out;
  }
  if (rows_in != rows_out) {
    // No transform called, hence just copy.
    memcpy(rows_out, rows_in, cache_pixs * sizeof(*rows_out));
  }
}